

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.c
# Opt level: O0

void sample_unit_disc(Sampler *sampler,float *x,float *y,float *pdf)

{
  float fVar1;
  float fVar2;
  float r;
  float theta;
  float v;
  float u;
  float *pdf_local;
  float *y_local;
  float *x_local;
  Sampler *sampler_local;
  
  _v = pdf;
  pdf_local = y;
  y_local = x;
  x_local = (float *)sampler;
  sample_unit_square(sampler,&theta,&r,(float *)0x0);
  fVar1 = sqrtf(r);
  fVar2 = cosf(theta * 6.2831855);
  *y_local = fVar1 * fVar2;
  fVar2 = sinf(theta * 6.2831855);
  *pdf_local = fVar1 * fVar2;
  if (_v != (float *)0x0) {
    *_v = 0.31830987;
  }
  return;
}

Assistant:

void sample_unit_disc(Sampler* sampler, float* x, float* y, float* pdf) {
    float u, v;
    sample_unit_square(sampler, &u, &v, NULL);
    float theta = 2 * PI * u;
    float r = sqrtf(v);

    *x = r * cosf(theta);
    *y = r * sinf(theta);
    if (pdf)
        *pdf = 1.0f / PI;
}